

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint2.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t big, expected;
    _PDCLIB_bigint2( &big, 0 );
    _PDCLIB_bigint32( &expected, 1 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 3 );
    _PDCLIB_bigint32( &expected, 8 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 31 );
    _PDCLIB_bigint32( &expected, UINT32_C( 0x80000000 ) );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 32 );
    _PDCLIB_bigint64( &expected, 1, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 34 );
    _PDCLIB_bigint64( &expected, 4, 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 63 );
    _PDCLIB_bigint64( &expected, UINT32_C( 0x80000000 ), 0 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );

    _PDCLIB_bigint2( &big, 64 );
    _PDCLIB_bigint_mul_dig( &expected, 2 );
    TESTCASE( _PDCLIB_bigint_cmp( &big, &expected ) == 0 );
#endif
    return TEST_RESULTS;
}